

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  rhs_parts;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  lhs_parts;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  string local_50;
  
  GetParts(&local_70,this,lhs);
  GetParts(&local_90,this,rhs);
  local_b0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_70.first,0,local_90.first._M_len);
  __str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_90.first,0,local_70.first._M_len);
  iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_b0,__str);
  if (iVar2 == 0) {
    if (local_70.first._M_len == local_90.first._M_len) {
      bVar1 = std::operator<(local_70.second,local_90.second);
    }
    else {
      AsString_abi_cxx11_((string *)&local_b0,this,lhs);
      AsString_abi_cxx11_(&local_50,this,rhs);
      bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_b0,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  else {
    bVar1 = SUB41((uint)iVar2 >> 0x1f,0);
  }
  return bVar1;
}

Assistant:

bool operator()(const SymbolEntry& lhs, const SymbolEntry& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }